

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O1

int allphone_search_step(ps_search_t *search,int frame_idx)

{
  int *piVar1;
  int iVar2;
  acmod_t *acmod_00;
  bin_mdef_t *pbVar3;
  ps_search_t *ppVar4;
  cmd_ln_t *pcVar5;
  int32 iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  _func_int_ps_search_t_ptr *p_Var10;
  ulong uVar11;
  undefined8 *puVar12;
  long *plVar13;
  long *plVar14;
  int iVar15;
  int n;
  ps_latlink_t *ppVar16;
  short sVar17;
  long lVar18;
  hmm_t *phVar19;
  acmod_t *acmod;
  int local_5c;
  int32 local_58;
  int32 local_54;
  cmd_ln_t *local_50;
  ps_search_t *local_48;
  bin_mdef_t *local_40;
  ps_latlink_t *local_38;
  
  acmod_00 = search->acmod;
  local_5c = frame_idx;
  if (acmod_00->compallsen == '\0') {
    pbVar3 = acmod_00->mdef;
    acmod_clear_active(acmod_00);
    if (0 < pbVar3->n_ciphone) {
      lVar18 = 0;
      do {
        for (phVar19 = (hmm_t *)(&(search[1].pls)->vt)[lVar18]; phVar19 != (hmm_t *)0x0;
            phVar19 = *(hmm_t **)(phVar19[1].score + 4)) {
          if (phVar19->frame == *(int *)&search[1].d2p) {
            acmod_activate_hmm(acmod_00,phVar19);
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < pbVar3->n_ciphone);
    }
  }
  p_Var10 = (_func_int_ps_search_t_ptr *)acmod_score(acmod_00,&local_5c);
  *(int *)&search[1].dag = *(int *)&search[1].dag + acmod_00->n_senone_active;
  pbVar3 = search->acmod->mdef;
  ppVar4 = search[1].pls;
  (search[1].vt)->finish = p_Var10;
  if (pbVar3->n_ciphone < 1) {
    iVar15 = -0x20000000;
  }
  else {
    iVar15 = -0x20000000;
    uVar7 = 0;
    sVar17 = 0;
    do {
      for (phVar19 = (hmm_t *)(&ppVar4->vt)[uVar7]; phVar19 != (hmm_t *)0x0;
          phVar19 = *(hmm_t **)(phVar19[1].score + 4)) {
        if (phVar19->frame == *(int *)&search[1].d2p) {
          piVar1 = (int *)((long)&search[1].hyp_str + 4);
          *piVar1 = *piVar1 + 1;
          iVar6 = hmm_vit_eval(phVar19);
          if (iVar15 < iVar6) {
            iVar15 = iVar6;
          }
        }
      }
      sVar17 = sVar17 + 1;
      uVar7 = (uint)sVar17;
    } while ((int)uVar7 < pbVar3->n_ciphone);
  }
  ppVar16 = search[1].last_link;
  n = *(int *)&ppVar16->best_prev;
  local_40 = search->acmod->mdef;
  if (0 < local_40->n_ciphone) {
    iVar2 = *(int *)((long)&search[1].acmod + 4);
    local_48 = search[1].pls;
    iVar9 = *(int *)&search[1].d2p;
    local_50 = search[1].config;
    uVar11 = 0;
    sVar17 = 0;
    local_38 = ppVar16;
    do {
      for (phVar19 = (hmm_t *)(&local_48->vt)[uVar11]; phVar19 != (hmm_t *)0x0;
          phVar19 = *(hmm_t **)(phVar19[1].score + 4)) {
        if (phVar19->frame == iVar9) {
          if (phVar19->bestscore < iVar2 + iVar15) {
            hmm_clear(phVar19);
          }
          else {
            puVar12 = (undefined8 *)
                      __ckd_calloc__(1,0x18,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                     ,0x197);
            *(int *)(puVar12 + 2) = iVar9;
            *puVar12 = phVar19;
            iVar6 = phVar19->out_history;
            *(int32 *)((long)puVar12 + 0x14) = iVar6;
            *(int32 *)(puVar12 + 1) = phVar19->out_score;
            if (search[1].type == (char *)0x0) {
              *(undefined4 *)((long)puVar12 + 0xc) = *(undefined4 *)((long)&search[1].dict + 4);
            }
            else if (iVar6 < 1) {
              *(undefined4 *)((long)puVar12 + 0xc) = 0;
            }
            else {
              plVar13 = (long *)blkarray_list_get((blkarray_list_t *)ppVar16,iVar6);
              if (*(int *)((long)plVar13 + 0x14) < 1) {
                iVar8 = ngram_bg_score((ngram_model_t *)search[1].type,
                                       (&local_50->refcount)[*(short *)(*plVar13 + 0x5c)],
                                       (&local_50->refcount)[*(short *)((long)&phVar19[1].ctx + 4)],
                                       &local_58);
              }
              else {
                plVar14 = (long *)blkarray_list_get((blkarray_list_t *)ppVar16,
                                                    *(int32 *)((long)puVar12 + 0x14));
                iVar8 = ngram_tg_score((ngram_model_t *)search[1].type,
                                       (&local_50->refcount)[*(short *)(*plVar14 + 0x5c)],
                                       (&local_50->refcount)[*(short *)(*plVar13 + 0x5c)],
                                       (&local_50->refcount)[*(short *)((long)&phVar19[1].ctx + 4)],
                                       &local_58);
              }
              *(int *)((long)puVar12 + 0xc) = iVar8 >> 10;
              ppVar16 = local_38;
            }
            blkarray_list_append((blkarray_list_t *)ppVar16,puVar12);
            phVar19->frame = iVar9 + 1;
          }
        }
      }
      sVar17 = sVar17 + 1;
      uVar11 = (ulong)(uint)(int)sVar17;
    } while ((int)sVar17 < local_40->n_ciphone);
  }
  ppVar16 = search[1].last_link;
  if (n < *(int *)&ppVar16->best_prev) {
    iVar2 = *(int *)&search[1].d2p;
    pcVar5 = search[1].config;
    do {
      plVar13 = (long *)blkarray_list_get((blkarray_list_t *)ppVar16,n);
      lVar18 = *plVar13;
      for (puVar12 = *(undefined8 **)(lVar18 + 0x78); puVar12 != (undefined8 *)0x0;
          puVar12 = (undefined8 *)puVar12[1]) {
        phVar19 = (hmm_t *)*puVar12;
        if ((ngram_model_t *)search[1].type == (ngram_model_t *)0x0) {
          iVar9 = *(int *)((long)&search[1].dict + 4);
        }
        else {
          if (*(int32 *)((long)plVar13 + 0x14) < 1) {
            iVar9 = ngram_bg_score((ngram_model_t *)search[1].type,
                                   (&pcVar5->refcount)[*(short *)(lVar18 + 0x5c)],
                                   (&pcVar5->refcount)[*(short *)((long)&phVar19[1].ctx + 4)],
                                   &local_54);
          }
          else {
            plVar14 = (long *)blkarray_list_get((blkarray_list_t *)search[1].last_link,
                                                *(int32 *)((long)plVar13 + 0x14));
            iVar9 = ngram_tg_score((ngram_model_t *)search[1].type,
                                   (&pcVar5->refcount)[*(short *)(*plVar14 + 0x5c)],
                                   (&pcVar5->refcount)[*(short *)(lVar18 + 0x5c)],
                                   (&pcVar5->refcount)[*(short *)((long)&phVar19[1].ctx + 4)],
                                   &local_54);
          }
          iVar9 = iVar9 >> 10;
        }
        iVar9 = iVar9 + (int)plVar13[1];
        if ((*(int *)&search[1].acmod + iVar15 < iVar9) && (phVar19->score[0] < iVar9)) {
          hmm_enter(phVar19,iVar9,n,iVar2 + 1);
        }
      }
      n = n + 1;
      ppVar16 = search[1].last_link;
    } while (n < *(int *)&ppVar16->best_prev);
  }
  *(int *)&search[1].d2p = *(int *)&search[1].d2p + 1;
  return 0;
}

Assistant:

int
allphone_search_step(ps_search_t * search, int frame_idx)
{
    int32 bestscr, frame_history_start;
    const int16 *senscr;
    allphone_search_t *allphs = (allphone_search_t *) search;
    acmod_t *acmod = search->acmod;

    if (!acmod->compallsen)
        allphone_search_sen_active(allphs);
    senscr = acmod_score(acmod, &frame_idx);
    allphs->n_sen_eval += acmod->n_senone_active;
    bestscr = phmm_eval_all(allphs, senscr);

    frame_history_start = blkarray_list_n_valid(allphs->history);
    phmm_exit(allphs, bestscr);
    phmm_trans(allphs, bestscr, frame_history_start);

    allphs->frame++;

    return 0;
}